

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_addapply(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  OBJ_DATA *pOVar3;
  OBJ_APPLY_DATA *pOVar4;
  int location;
  int modifier;
  char arg3 [4608];
  char arg2 [4608];
  char arg1 [4608];
  OBJ_APPLY_DATA *app_next;
  OBJ_APPLY_DATA *app;
  AFFECT_DATA af;
  AFFECT_DATA *paf_next;
  AFFECT_DATA *paf;
  OBJ_DATA *obj;
  AFFECT_DATA *in_stack_ffffffffffffc948;
  undefined4 in_stack_ffffffffffffc950;
  int iVar5;
  undefined4 in_stack_ffffffffffffc954;
  char in_stack_ffffffffffffc958;
  undefined7 in_stack_ffffffffffffc959;
  char *in_stack_ffffffffffffc960;
  char *in_stack_ffffffffffffc970;
  char *in_stack_ffffffffffffc978;
  char *in_stack_ffffffffffffdb50;
  char in_stack_ffffffffffffdb58;
  undefined7 in_stack_ffffffffffffdb59;
  char local_12a8;
  OBJ_APPLY_DATA *local_98;
  AFFECT_DATA *local_20;
  
  one_argument((char *)CONCAT44(in_stack_ffffffffffffc954,in_stack_ffffffffffffc950),
               (char *)in_stack_ffffffffffffc948);
  one_argument((char *)CONCAT44(in_stack_ffffffffffffc954,in_stack_ffffffffffffc950),
               (char *)in_stack_ffffffffffffc948);
  one_argument((char *)CONCAT44(in_stack_ffffffffffffc954,in_stack_ffffffffffffc950),
               (char *)in_stack_ffffffffffffc948);
  if ((local_12a8 == '\0') || (in_stack_ffffffffffffdb58 == '\0')) {
    send_to_char(in_stack_ffffffffffffc960,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc959,in_stack_ffffffffffffc958));
    send_to_char(in_stack_ffffffffffffc960,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc959,in_stack_ffffffffffffc958));
    send_to_char(in_stack_ffffffffffffc960,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc959,in_stack_ffffffffffffc958));
    send_to_char(in_stack_ffffffffffffc960,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc959,in_stack_ffffffffffffc958));
    send_to_char(in_stack_ffffffffffffc960,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc959,in_stack_ffffffffffffc958));
    send_to_char(in_stack_ffffffffffffc960,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc959,in_stack_ffffffffffffc958));
    send_to_char(in_stack_ffffffffffffc960,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc959,in_stack_ffffffffffffc958));
    send_to_char(in_stack_ffffffffffffc960,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc959,in_stack_ffffffffffffc958));
    send_to_char(in_stack_ffffffffffffc960,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc959,in_stack_ffffffffffffc958));
    send_to_char(in_stack_ffffffffffffc960,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc959,in_stack_ffffffffffffc958));
  }
  else {
    pOVar3 = get_obj_world((CHAR_DATA *)
                           CONCAT71(in_stack_ffffffffffffdb59,in_stack_ffffffffffffdb58),
                           in_stack_ffffffffffffdb50);
    if (pOVar3 == (OBJ_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffc960,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc959,in_stack_ffffffffffffc958));
    }
    else {
      bVar1 = str_prefix(in_stack_ffffffffffffc978,in_stack_ffffffffffffc970);
      if (bVar1) {
        if (in_stack_ffffffffffffc958 != '\0') {
          bVar1 = str_prefix(in_stack_ffffffffffffc978,in_stack_ffffffffffffc970);
          if (bVar1) {
            bVar1 = str_prefix(in_stack_ffffffffffffc978,in_stack_ffffffffffffc970);
            if (bVar1) {
              bVar1 = str_prefix(in_stack_ffffffffffffc978,in_stack_ffffffffffffc970);
              if (bVar1) {
                bVar1 = str_prefix(in_stack_ffffffffffffc978,in_stack_ffffffffffffc970);
                if (bVar1) {
                  bVar1 = str_prefix(in_stack_ffffffffffffc978,in_stack_ffffffffffffc970);
                  if (bVar1) {
                    bVar1 = str_prefix(in_stack_ffffffffffffc978,in_stack_ffffffffffffc970);
                    if (bVar1) {
                      bVar1 = str_prefix(in_stack_ffffffffffffc978,in_stack_ffffffffffffc970);
                      if (bVar1) {
                        bVar1 = str_prefix(in_stack_ffffffffffffc978,in_stack_ffffffffffffc970);
                        if (bVar1) {
                          bVar1 = str_prefix(in_stack_ffffffffffffc978,in_stack_ffffffffffffc970);
                          if (bVar1) {
                            bVar1 = str_prefix(in_stack_ffffffffffffc978,in_stack_ffffffffffffc970);
                            if (bVar1) {
                              bVar1 = str_prefix(in_stack_ffffffffffffc978,in_stack_ffffffffffffc970
                                                );
                              if (bVar1) {
                                bVar1 = str_prefix(in_stack_ffffffffffffc978,
                                                   in_stack_ffffffffffffc970);
                                if (bVar1) {
                                  bVar1 = str_prefix(in_stack_ffffffffffffc978,
                                                     in_stack_ffffffffffffc970);
                                  if (bVar1) {
                                    send_to_char(in_stack_ffffffffffffc960,
                                                 (CHAR_DATA *)
                                                 CONCAT71(in_stack_ffffffffffffc959,
                                                          in_stack_ffffffffffffc958));
                                    return;
                                  }
                                  iVar5 = 0x1a;
                                }
                                else {
                                  iVar5 = 0x19;
                                }
                              }
                              else {
                                iVar5 = 0x13;
                              }
                            }
                            else {
                              iVar5 = 0x12;
                            }
                          }
                          else {
                            iVar5 = 0x11;
                          }
                        }
                        else {
                          iVar5 = 0xe;
                        }
                      }
                      else {
                        iVar5 = 0xc;
                      }
                    }
                    else {
                      iVar5 = 5;
                    }
                  }
                  else {
                    iVar5 = 4;
                  }
                }
                else {
                  iVar5 = 3;
                }
              }
              else {
                iVar5 = 2;
              }
            }
            else {
              iVar5 = 1;
            }
          }
          else {
            iVar5 = 0xd;
          }
          if (iVar5 == 0x1a) {
            init_affect((AFFECT_DATA *)0x59a881);
            iVar2 = skill_lookup((char *)CONCAT71(in_stack_ffffffffffffc959,
                                                  in_stack_ffffffffffffc958));
            if ((short)iVar2 == -1) {
              send_to_char(in_stack_ffffffffffffc960,
                           (CHAR_DATA *)
                           CONCAT71(in_stack_ffffffffffffc959,in_stack_ffffffffffffc958));
              return;
            }
            charaff_to_obj((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffc954,iVar5),
                           in_stack_ffffffffffffc948);
          }
          else {
            pOVar4 = new_apply_data();
            pOVar4->location = (short)iVar5;
            bVar1 = is_number((char *)in_stack_ffffffffffffc948);
            if (!bVar1) {
              send_to_char(in_stack_ffffffffffffc960,
                           (CHAR_DATA *)
                           CONCAT71(in_stack_ffffffffffffc959,in_stack_ffffffffffffc958));
              return;
            }
            iVar5 = atoi(&stack0xffffffffffffc958);
            pOVar4->modifier = (short)iVar5;
            pOVar4->next = pOVar3->apply;
            pOVar3->apply = pOVar4;
          }
          send_to_char(in_stack_ffffffffffffc960,
                       (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc959,in_stack_ffffffffffffc958));
        }
      }
      else {
        local_20 = pOVar3->charaffs;
        while (local_20 != (AFFECT_DATA *)0x0) {
          local_20 = local_20->next;
          free_affect((AFFECT_DATA *)0x59a512);
        }
        pOVar3->charaffs = (AFFECT_DATA *)0x0;
        for (local_98 = pOVar3->apply; local_98 != (OBJ_APPLY_DATA *)0x0; local_98 = local_98->next)
        {
        }
        pOVar3->apply = (OBJ_APPLY_DATA *)0x0;
        act(in_stack_ffffffffffffc960,
            (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc959,in_stack_ffffffffffffc958),
            (void *)CONCAT44(in_stack_ffffffffffffc954,in_stack_ffffffffffffc950),
            in_stack_ffffffffffffc948,0);
      }
    }
  }
  return;
}

Assistant:

void do_addapply(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj;
	AFFECT_DATA *paf, *paf_next, af;
	OBJ_APPLY_DATA *app, *app_next;
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	int modifier, location;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	argument = one_argument(argument, arg3);

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Syntax for applies: addapply <object> <apply type> <value>\n\r", ch);
		send_to_char("                    addapply <object> clear\n\r", ch);
		send_to_char("Apply Types: hp str dex int wis con mana\n\r", ch);
		send_to_char("             ac move hitroll damroll saves\n\r\n\r", ch);
		send_to_char("Syntax for affects: addapply <object> affect <affect name>\n\r", ch);
		send_to_char("Affect Names: blind invisible detect_evil detect_invis detect_magic\n\r", ch);
		send_to_char("              detect_hidden detect_good sanctuary infrared\n\r", ch);
		send_to_char("              curse poison protect_evil protect_good sneak hide sleep charm\n\r", ch);
		send_to_char("              flying pass_door haste calm plague weaken dark_vision berserk\n\r", ch);
		send_to_char("              waterbreath regeneration slow\n\r", ch);
		return;
	}

	obj = get_obj_world(ch, arg1);
	if (obj == nullptr)
	{
		send_to_char("No such object exists!\n\r", ch);
		return;
	}

	if (!str_prefix(arg2, "clear"))
	{
		for (paf = obj->charaffs; paf; paf = paf_next)
		{
			paf_next = paf->next;
			free_affect(paf);
		}

		obj->charaffs = nullptr;

		for (app = obj->apply; app; app = app_next)
		{
			app_next = app->next;
		}

		obj->apply = nullptr;

		act("All affects removed from $p.", ch, obj, 0, TO_CHAR);
		return;
	}

	if (arg3[0] == '\0')
		return;

	if (!str_prefix(arg2, "hp"))
		location = APPLY_HIT;
	else if (!str_prefix(arg2, "str"))
		location = APPLY_STR;
	else if (!str_prefix(arg2, "dex"))
		location = APPLY_DEX;
	else if (!str_prefix(arg2, "int"))
		location = APPLY_INT;
	else if (!str_prefix(arg2, "wis"))
		location = APPLY_WIS;
	else if (!str_prefix(arg2, "con"))
		location = APPLY_CON;
	else if (!str_prefix(arg2, "mana"))
		location = APPLY_MANA;
	else if (!str_prefix(arg2, "move"))
		location = APPLY_MOVE;
	else if (!str_prefix(arg2, "ac"))
		location = APPLY_AC;
	else if (!str_prefix(arg2, "hitroll"))
		location = APPLY_HITROLL;
	else if (!str_prefix(arg2, "damroll"))
		location = APPLY_DAMROLL;
	else if (!str_prefix(arg2, "saves"))
		location = APPLY_SAVING_SPELL;
	else if (!str_prefix(arg2, "affect"))
		location = APPLY_SPELL_AFFECT;
	else
	{
		send_to_char("That apply is not possible!\n\r", ch);
		return;
	}

	if (location != APPLY_SPELL_AFFECT)
	{
		app = new_apply_data();
		app->location = location;

		if (is_number(arg3))
		{
			modifier = atoi(arg3);
		}
		else
		{
			send_to_char("Applies require a numerical value.\n\r", ch);
			return;
		}

		app->modifier = modifier;
		app->next = obj->apply;
		obj->apply = app;
	}
	else
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = skill_lookup(arg3);

		if (af.type == -1)
		{
			send_to_char("Invalid affect.\n\r", ch);
			return;
		}

		af.level = obj->level;
		af.duration = -1;
		af.location = 0;
		af.modifier = 0;
		af.owner = nullptr;
		charaff_to_obj(obj, &af);
	}

	send_to_char("Ok.\n\r", ch);
}